

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_test_connection.c
# Opt level: O1

apx_error_t
apx_clientTestConnection_publish_remote_file
          (apx_clientTestConnection_t *self,uint32_t address,char *file_name,apx_size_t file_size)

{
  apx_size_t aVar1;
  apx_error_t aVar2;
  apx_fileManager_t *self_00;
  rmf_fileInfo_t *file;
  uint8_t buffer [311];
  uint8_t auStack_168 [4];
  uint8_t local_164 [316];
  
  aVar2 = 1;
  if (file_name != (char *)0x0 && self != (apx_clientTestConnection_t *)0x0) {
    self_00 = apx_clientConnection_get_file_manager(&self->base);
    if (self_00 == (apx_fileManager_t *)0x0) {
      __assert_fail("file_manager != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client_test_connection.c"
                    ,0x139,
                    "apx_error_t apx_clientTestConnection_publish_remote_file(apx_clientTestConnection_t *, uint32_t, const char *, apx_size_t)"
                   );
    }
    aVar1 = rmf_address_encode(auStack_168,4,0x3ffffc00,false);
    aVar2 = 6;
    if (aVar1 == 4) {
      file = rmf_fileInfo_make_fixed(file_name,file_size,address);
      aVar1 = rmf_encode_publish_file_cmd(local_164,0x133,file);
      rmf_fileInfo_delete(file);
      if (aVar1 != 0) {
        aVar2 = apx_fileManager_message_received(self_00,auStack_168,aVar1 + 4);
      }
    }
  }
  return aVar2;
}

Assistant:

apx_error_t apx_clientTestConnection_publish_remote_file(apx_clientTestConnection_t* self, uint32_t address, char const* file_name, apx_size_t file_size)
{
   if (self != NULL && file_name != NULL)
   {
      uint8_t  buffer[RMF_HIGH_ADDR_SIZE + RMF_CMD_TYPE_SIZE + RMF_FILE_INFO_HEADER_SIZE + RMF_FILE_NAME_MAX_SIZE];
      rmf_fileInfo_t *file_info;
      apx_fileManager_t* file_manager = apx_clientConnection_get_file_manager(&self->base);
      assert(file_manager != NULL);


      if (rmf_address_encode(buffer, RMF_HIGH_ADDR_SIZE, RMF_CMD_AREA_START_ADDRESS, false) != RMF_HIGH_ADDR_SIZE)
      {
         return APX_INTERNAL_ERROR;
      }
      file_info = rmf_fileInfo_make_fixed(file_name, file_size, address);
      apx_size_t const max_cmd_size = sizeof(buffer) - RMF_HIGH_ADDR_SIZE;
      apx_size_t const cmd_size = rmf_encode_publish_file_cmd(buffer + RMF_HIGH_ADDR_SIZE, max_cmd_size, file_info);
      rmf_fileInfo_delete(file_info);
      if (cmd_size == 0)
      {
         return APX_INTERNAL_ERROR;
      }
      return apx_fileManager_message_received(file_manager, buffer, RMF_HIGH_ADDR_SIZE + cmd_size);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}